

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

vocwdef * vocffw(voccxdef *ctx,char *wrd,int len,char *wrd2,int len2,int p,vocseadef *search_ctx)

{
  uint uVar1;
  int iVar2;
  uchar *in_RCX;
  uint in_EDX;
  uchar *in_RSI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined8 *in_stack_00000008;
  vocwdef *vwf;
  vocwdef *vw;
  vocdef *vf;
  vocdef *v;
  uint hshval;
  int in_stack_ffffffffffffff6c;
  uchar *in_stack_ffffffffffffff70;
  vocwdef *local_78;
  vocwdef *local_60;
  vocwdef *local_50;
  vocwdef *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  uVar1 = vochsh(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  local_38 = *(undefined8 **)(in_RDI + 0x670 + (ulong)uVar1 * 8);
  local_40 = (undefined8 *)0x0;
  do {
    if (local_38 == (undefined8 *)0x0 || local_40 != (undefined8 *)0x0) {
      if (local_40 == (undefined8 *)0x0) {
        local_50 = (vocwdef *)0x0;
      }
      if (in_stack_00000008 != (undefined8 *)0x0) {
        *in_stack_00000008 = local_40;
        in_stack_00000008[1] = local_50;
        in_stack_00000008[2] = in_RSI;
        *(uint *)(in_stack_00000008 + 3) = in_EDX;
        in_stack_00000008[4] = in_RCX;
        *(uint *)(in_stack_00000008 + 5) = in_R8D;
      }
      return local_50;
    }
    iVar2 = voceq(in_RSI,in_EDX,(uchar *)(local_38 + 2),(uint)*(byte *)(local_38 + 1));
    if ((iVar2 != 0) &&
       (iVar2 = voceq(in_RCX,in_R8D,
                      (uchar *)((long)local_38 + (long)(int)(uint)*(byte *)(local_38 + 1) + 0x10),
                      (uint)*(byte *)((long)local_38 + 9)), iVar2 != 0)) {
      if (*(int *)((long)local_38 + 0xc) == -1) {
        local_60 = (vocwdef *)0x0;
      }
      else {
        local_60 = (vocwdef *)
                   (*(long *)(in_RDI + 0xe70 + ((ulong)*(uint *)((long)local_38 + 0xc) / 2000) * 8)
                   + ((ulong)*(uint *)((long)local_38 + 0xc) % 2000) * 8);
      }
      local_48 = local_60;
      while (local_48 != (vocwdef *)0x0) {
        if (((local_48->vocwtyp == in_R9D) && ((local_48->vocwflg & 1) == 0)) &&
           ((local_48->vocwflg & 8) == 0)) {
          local_40 = local_38;
          local_50 = local_48;
          break;
        }
        if (local_48->vocwnxt == 0xffffffff) {
          local_78 = (vocwdef *)0x0;
        }
        else {
          local_78 = (vocwdef *)
                     (*(long *)(in_RDI + 0xe70 + ((ulong)local_48->vocwnxt / 2000) * 8) +
                     ((ulong)local_48->vocwnxt % 2000) * 8);
        }
        local_48 = local_78;
      }
    }
    local_38 = (undefined8 *)*local_38;
  } while( true );
}

Assistant:

vocwdef *vocffw(voccxdef *ctx, char *wrd, int len, char *wrd2, int len2,
                int p, vocseadef *search_ctx)
{
    uint     hshval;
    vocdef  *v, *vf;
    vocwdef *vw, *vwf;

    /* get the word's hash value */
    hshval = vochsh((uchar *)wrd, len);

    /* scan the hash list until we run out of entries, or find a match */
    for (v = ctx->voccxhsh[hshval], vf = 0 ; v != 0 && vf == 0 ;
         v = v->vocnxt)
    {
        /* if this word matches, look at the objects in its list */
        if (voceq((uchar *)wrd, len, v->voctxt, v->voclen)
            && voceq((uchar *)wrd2, len2, v->voctxt + v->voclen, v->vocln2))
        {
            /* look for a suitable object in the vocwdef list */
            for (vw = vocwget(ctx, v->vocwlst) ; vw ;
                 vw = vocwget(ctx, vw->vocwnxt))
            {
                if (vw->vocwtyp == p && !(vw->vocwflg & VOCFCLASS)
                    && !(vw->vocwflg & VOCFDEL))
                {
                    /*
                     *   remember the first vocdef that we found, and
                     *   remember this, the first matching vocwdef; then
                     *   stop scanning, since we have a match 
                     */
                    vf = v;
                    vwf = vw;
                    break;
                }
            }
        }
    }

    /* set up the caller-provided search structure for next time */
    vw = (vf != 0 ? vwf : 0);
    if (search_ctx)
    {
        /* save the search position */
        search_ctx->v = vf;
        search_ctx->vw = vw;

        /* save the search criteria */
        search_ctx->wrd1 = (uchar *)wrd;
        search_ctx->len1 = len;
        search_ctx->wrd2 = (uchar *)wrd2;
        search_ctx->len2 = len2;
    }

    /* return the match */
    return vw;
}